

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void string_suite::test_empty(void)

{
  encoder_type encoder;
  string text;
  ostringstream result;
  undefined4 local_1ec;
  size_type local_1e8 [4];
  undefined **local_1c8;
  ostringstream *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"",(allocator<char> *)&local_1c8);
  local_1c8 = &PTR__base_00114b78;
  local_1c0 = local_180;
  local_1e8[0] = trial::protocol::json::detail::basic_encoder<char,24ul>::
                 string_value<std::__cxx11::string>
                           ((basic_encoder<char,24ul> *)&local_1c8,&local_1a0);
  local_1ec = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(text)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x234,"void string_suite::test_empty()",local_1e8,&local_1ec);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"\\\"\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x235,"void string_suite::test_empty()",local_1e8,"\"\"");
  std::__cxx11::string::~string((string *)local_1e8);
  (*(code *)*local_1c8)();
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_empty()
{
    std::ostringstream result;
    std::string text("");
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(text), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"\"");
}